

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MAW.cpp
# Opt level: O3

void __thiscall OpenMD::MAW::calcForce(MAW *this,InteractionData *idat)

{
  double dVar1;
  double dVar2;
  byte bVar3;
  char cVar4;
  pointer piVar5;
  undefined1 auVar6 [16];
  uint i_5;
  RotMat3x3d *pRVar7;
  undefined8 *puVar8;
  uint i;
  long lVar9;
  double *pdVar10;
  uint i_1;
  RotMat3x3d *pRVar11;
  long lVar12;
  long lVar13;
  double *pdVar14;
  undefined8 *puVar15;
  undefined8 *puVar16;
  long lVar17;
  byte bVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  double dVar21;
  RealType RVar22;
  double dVar23;
  double dVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  Vector<double,_3U> result;
  Vector3d dVangdu;
  Vector<double,_3U> result_10;
  Vector<double,_3U> result_3;
  Vector<double,_3U> result_5;
  Vector<double,_3U> result_15;
  Vector<double,_3U> result_12;
  RotMat3x3d Atrans;
  Vector<double,_3U> result_9;
  undefined8 local_228;
  undefined8 uStack_220;
  double local_218 [8];
  double local_1d8 [4];
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double dStack_1a0;
  double local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  double local_178;
  double local_168 [4];
  double local_148;
  undefined8 uStack_140;
  double local_138 [4];
  double local_118;
  undefined8 uStack_110;
  double local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  double local_d8;
  double local_d0;
  double local_c8 [4];
  undefined8 local_a8 [10];
  double local_58 [4];
  double local_38 [4];
  
  bVar18 = 0;
  if (this->initialized_ == false) {
    initialize(this);
  }
  piVar5 = (this->MAWtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar12 = *(long *)&(this->MixingMap).
                     super__Vector_base<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[piVar5[idat->atid1]].
                     super__Vector_base<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>
                     ._M_impl.super__Vector_impl_data;
  lVar17 = (long)piVar5[idat->atid2] * 0x30;
  local_1b8 = *(double *)(lVar12 + lVar17);
  dVar23 = *(double *)(lVar12 + 8 + lVar17);
  dVar28 = *(double *)(lVar12 + 0x10 + lVar17);
  local_218[7] = *(double *)(lVar12 + 0x20 + lVar17);
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[8] = 0;
  local_148 = *(double *)(lVar12 + 0x18 + lVar17);
  uStack_140 = 0;
  if (*(char *)(lVar12 + 0x29 + lVar17) == '\x01') {
    pRVar7 = &idat->A1;
    local_228 = 0.0;
    uStack_220 = 0.0;
    local_218[0] = 0.0;
    lVar9 = 0;
    pRVar11 = pRVar7;
    do {
      dVar21 = (double)(&local_228)[lVar9];
      lVar13 = 0;
      do {
        dVar21 = dVar21 + (pRVar11->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                          data_[0][lVar13] * (idat->d).super_Vector<double,_3U>.data_[lVar13];
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      (&local_228)[lVar9] = dVar21;
      lVar9 = lVar9 + 1;
      pRVar11 = (RotMat3x3d *)
                ((pRVar11->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1
                );
    } while (lVar9 != 3);
    pdVar10 = (double *)&local_228;
    local_198 = local_228;
    uStack_190 = 0;
    local_1a8 = uStack_220;
    dStack_1a0 = local_218[0];
    local_218[4] = 0.0;
    local_218[5] = 0.0;
    local_218[2] = 0.0;
    local_218[3] = 0.0;
    local_218[0] = 0.0;
    local_218[1] = 0.0;
    local_228 = 0.0;
    uStack_220 = 0.0;
    local_218[6] = 0.0;
    lVar9 = 0;
    do {
      lVar13 = 0;
      pdVar14 = pdVar10;
      do {
        *pdVar14 = (pRVar7->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                   [lVar13];
        lVar13 = lVar13 + 1;
        pdVar14 = pdVar14 + 3;
      } while (lVar13 != 3);
      lVar9 = lVar9 + 1;
      pdVar10 = pdVar10 + 1;
      pRVar7 = (RotMat3x3d *)
               ((pRVar7->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
    } while (lVar9 != 3);
    lVar9 = 0;
    do {
      *(undefined8 *)((long)local_a8 + lVar9 + 0x10) = *(undefined8 *)((long)local_218 + lVar9);
      *(undefined8 *)((long)local_a8 + lVar9) = *(undefined8 *)((long)&local_228 + lVar9);
      *(undefined8 *)((long)local_a8 + lVar9 + 8) = *(undefined8 *)((long)&uStack_220 + lVar9);
      lVar9 = lVar9 + 0x18;
    } while (lVar9 != 0x48);
  }
  else {
    pRVar7 = &idat->A2;
    pdVar10 = (double *)&local_228;
    pRVar11 = pRVar7;
    pdVar14 = pdVar10;
    for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
      *pdVar14 = (pRVar11->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                 [0];
      pRVar11 = (RotMat3x3d *)((long)pRVar11 + (ulong)bVar18 * -0x10 + 8);
      pdVar14 = pdVar14 + (ulong)bVar18 * -2 + 1;
    }
    lVar9 = 0;
    do {
      lVar13 = 0;
      do {
        pdVar10[lVar13] = -pdVar10[lVar13];
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      lVar9 = lVar9 + 1;
      pdVar10 = pdVar10 + 3;
    } while (lVar9 != 3);
    local_168[0] = 0.0;
    local_168[1] = 0.0;
    local_168[2] = 0.0;
    puVar8 = &local_228;
    lVar9 = 0;
    do {
      dVar21 = local_168[lVar9];
      lVar13 = 0;
      do {
        dVar21 = dVar21 + (double)puVar8[lVar13] * (idat->d).super_Vector<double,_3U>.data_[lVar13];
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      local_168[lVar9] = dVar21;
      lVar9 = lVar9 + 1;
      puVar8 = puVar8 + 3;
    } while (lVar9 != 3);
    local_198 = local_168[0];
    uStack_190 = 0;
    local_1a8 = local_168[1];
    dStack_1a0 = local_168[2];
    pdVar10 = (double *)&local_228;
    local_218[4] = 0.0;
    local_218[5] = 0.0;
    local_218[2] = 0.0;
    local_218[3] = 0.0;
    local_218[0] = 0.0;
    local_218[1] = 0.0;
    local_228 = 0.0;
    uStack_220 = 0.0;
    local_218[6] = 0.0;
    lVar9 = 0;
    do {
      lVar13 = 0;
      pdVar14 = pdVar10;
      do {
        *pdVar14 = (pRVar7->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                   [lVar13];
        lVar13 = lVar13 + 1;
        pdVar14 = pdVar14 + 3;
      } while (lVar13 != 3);
      lVar9 = lVar9 + 1;
      pdVar10 = pdVar10 + 1;
      pRVar7 = (RotMat3x3d *)
               ((pRVar7->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
    } while (lVar9 != 3);
    lVar9 = 0;
    do {
      *(undefined8 *)((long)local_a8 + lVar9 + 0x10) = *(undefined8 *)((long)local_218 + lVar9);
      *(undefined8 *)((long)local_a8 + lVar9) = *(undefined8 *)((long)&local_228 + lVar9);
      *(undefined8 *)((long)local_a8 + lVar9 + 8) = *(undefined8 *)((long)&uStack_220 + lVar9);
      lVar9 = lVar9 + 0x18;
    } while (lVar9 != 0x48);
  }
  uStack_100 = 0;
  local_118 = -dVar28;
  uStack_110 = 0x8000000000000000;
  local_108 = dVar28;
  local_d0 = exp((idat->rij - dVar23) * local_118);
  local_d8 = local_d0 * local_d0;
  dVar28 = local_d8 - (local_d0 + local_d0);
  uVar25 = SUB84(local_1b8,0);
  uVar26 = (undefined4)((ulong)local_1b8 >> 0x20);
  if (idat->shiftedPot == false) {
    dVar21 = 0.0;
    uVar19 = 0;
    uVar20 = 0;
    bVar3 = 0;
    dVar34 = local_1b8 + local_1b8;
    if (idat->shiftedForce != true) goto LAB_00251650;
  }
  dVar23 = (idat->rcut - dVar23) * local_118;
  local_118 = local_1b8 + local_1b8;
  dVar21 = exp(dVar23);
  uVar19 = SUB84(dVar21,0);
  uVar20 = (undefined4)((ulong)dVar21 >> 0x20);
  uVar25 = SUB84(local_1b8,0);
  uVar26 = (undefined4)((ulong)local_1b8 >> 0x20);
  dVar21 = dVar21 * dVar21;
  bVar3 = idat->shiftedPot;
  dVar34 = local_118;
LAB_00251650:
  dVar34 = dVar34 * local_108;
  if ((bVar3 & 1) == 0) {
    RVar22 = idat->rij;
    dVar23 = 0.0;
    if (idat->shiftedForce == true) {
      dVar23 = ((double)CONCAT44(uVar20,uVar19) - dVar21) * dVar34;
      dVar21 = (double)CONCAT44(uVar26,uVar25) *
               (dVar21 - ((double)CONCAT44(uVar20,uVar19) + (double)CONCAT44(uVar20,uVar19))) +
               (RVar22 - idat->rcut) * dVar23;
    }
    else {
      dVar21 = 0.0;
    }
  }
  else {
    dVar21 = (double)CONCAT44(uVar26,uVar25) *
             (dVar21 - ((double)CONCAT44(uVar20,uVar19) + (double)CONCAT44(uVar20,uVar19)));
    RVar22 = idat->rij;
    dVar23 = 0.0;
  }
  dVar21 = dVar28 * (double)CONCAT44(uVar26,uVar25) - dVar21;
  dVar28 = idat->r2;
  dVar1 = idat->sw;
  local_1b8 = dStack_1a0;
  dStack_1b0 = dStack_1a0;
  local_108 = local_218[7] * dStack_1a0;
  uStack_100 = 0;
  dVar27 = local_148 / -3.0 + 0.8 +
           local_108 / RVar22 + (local_148 * local_198 * local_198) / dVar28;
  dVar2 = idat->vdwMult;
  dVar24 = dVar21 * dVar2;
  dVar33 = dVar24 * dVar27;
  dVar32 = dVar1 * dVar33;
  idat->vpair = dVar33 + idat->vpair;
  (idat->pot).data_[1] = (idat->pot).data_[1] + dVar32;
  if (idat->isSelected == true) {
    (idat->selePot).data_[1] = dVar32 + (idat->selePot).data_[1];
  }
  dVar32 = dVar28 * RVar22;
  dVar33 = dVar28 * dVar28;
  local_1d8[0] = local_198;
  local_1d8[1] = local_1a8;
  local_1d8[2] = dStack_1a0;
  local_138[0] = 0.0;
  local_138[1] = 0.0;
  local_138[2] = 0.0;
  lVar9 = 0;
  do {
    local_138[lVar9] = local_1d8[lVar9] * (dVar34 * (local_d0 - local_d8) - dVar23);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  local_228 = 0.0;
  uStack_220 = 0.0;
  local_218[0] = 0.0;
  lVar9 = 0;
  do {
    (&local_228)[lVar9] = local_138[lVar9] / RVar22;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  local_168[2] = local_218[0];
  local_168[0] = local_228;
  local_168[1] = uStack_220;
  dVar23 = local_148 * -2.0;
  dVar35 = local_198 * local_198 * dVar23;
  dVar34 = local_198 * local_148 * 2.0;
  local_148 = dVar28;
  uStack_140 = 0;
  auVar31._8_8_ = local_198 * dVar35;
  auVar31._0_8_ = dVar34;
  auVar30._8_8_ = dVar33;
  auVar30._0_8_ = dVar28;
  auVar31 = divpd(auVar31,auVar30);
  auVar29._0_8_ = dStack_1a0 * local_218[7] * local_198;
  auVar29._8_8_ = local_1a8 * local_108;
  auVar6._8_8_ = dVar32;
  auVar6._0_8_ = dVar32;
  auVar30 = divpd(auVar29,auVar6);
  local_138[0] = (auVar31._8_8_ + auVar31._0_8_) - auVar30._0_8_;
  local_138[1] = (local_1a8 * dVar35) / dVar33 - auVar30._8_8_;
  local_138[2] = (local_218[7] / RVar22 + (dVar35 * dStack_1a0) / dVar33) -
                 (dStack_1a0 * dStack_1a0 * local_218[7]) / dVar32;
  local_228 = 0.0;
  uStack_220 = 0.0;
  local_218[0] = 0.0;
  lVar9 = 0;
  do {
    (&local_228)[lVar9] = local_168[lVar9] * dVar27;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  local_1d8[0] = 0.0;
  local_1d8[1] = 0.0;
  local_1d8[2] = 0.0;
  lVar9 = 0;
  do {
    local_1d8[lVar9] = local_138[lVar9] * dVar21;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  local_38[0] = 0.0;
  local_38[1] = 0.0;
  local_38[2] = 0.0;
  lVar9 = 0;
  do {
    local_38[lVar9] = (double)(&local_228)[lVar9] + local_1d8[lVar9];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  local_1d8[0] = (local_218[7] * local_1a8) / RVar22;
  local_1d8[1] = (dVar34 * dStack_1a0) / dVar28 - (local_218[7] * local_198) / RVar22;
  local_1d8[2] = (local_198 * dVar23 * local_1a8) / dVar28;
  local_188 = 0;
  uStack_180 = 0;
  local_178 = 0.0;
  lVar9 = 0;
  do {
    (&local_188)[lVar9] = local_1d8[lVar9] * dVar24;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  local_228 = 0.0;
  uStack_220 = 0.0;
  local_218[0] = 0.0;
  lVar9 = 0;
  do {
    (&local_228)[lVar9] = (double)(&local_188)[lVar9] * dVar1;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  local_58[2] = local_218[0];
  local_58[0] = local_228;
  local_58[1] = uStack_220;
  cVar4 = *(char *)(lVar12 + lVar17 + 0x29);
  if (cVar4 == '\x01') {
    local_228 = 0.0;
    uStack_220 = 0.0;
    local_218[0] = 0.0;
    puVar8 = local_a8;
    lVar12 = 0;
    do {
      dVar23 = (double)(&local_228)[lVar12];
      lVar17 = 0;
      do {
        dVar23 = dVar23 + (double)puVar8[lVar17] * local_58[lVar17];
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
      (&local_228)[lVar12] = dVar23;
      lVar12 = lVar12 + 1;
      puVar8 = puVar8 + 3;
    } while (lVar12 != 3);
    lVar12 = 0;
    do {
      (idat->t1).super_Vector<double,_3U>.data_[lVar12] =
           (double)(&local_228)[lVar12] + (idat->t1).super_Vector<double,_3U>.data_[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
  }
  else {
    local_228 = 0.0;
    uStack_220 = 0.0;
    local_218[0] = 0.0;
    puVar8 = local_a8;
    lVar12 = 0;
    do {
      dVar23 = (double)(&local_228)[lVar12];
      lVar17 = 0;
      do {
        dVar23 = dVar23 + (double)puVar8[lVar17] * local_58[lVar17];
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
      (&local_228)[lVar12] = dVar23;
      lVar12 = lVar12 + 1;
      puVar8 = puVar8 + 3;
    } while (lVar12 != 3);
    lVar12 = 0;
    do {
      (idat->t2).super_Vector<double,_3U>.data_[lVar12] =
           (double)(&local_228)[lVar12] + (idat->t2).super_Vector<double,_3U>.data_[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
  }
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  local_c8[2] = 0.0;
  lVar12 = 0;
  do {
    local_c8[lVar12] = local_38[lVar12] * dVar2 * dVar1;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  if (cVar4 == '\0') {
    puVar8 = &local_228;
    puVar15 = local_a8;
    puVar16 = puVar8;
    for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar16 = *puVar15;
      puVar15 = puVar15 + (ulong)bVar18 * -2 + 1;
      puVar16 = puVar16 + (ulong)bVar18 * -2 + 1;
    }
    lVar12 = 0;
    do {
      lVar17 = 0;
      do {
        puVar8[lVar17] = puVar8[lVar17] ^ 0x8000000000000000;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
      lVar12 = lVar12 + 1;
      puVar8 = puVar8 + 3;
    } while (lVar12 != 3);
    local_f8 = 0;
    uStack_f0 = 0;
    local_e8 = 0;
    puVar8 = &local_228;
    lVar12 = 0;
    do {
      dVar23 = (double)(&local_f8)[lVar12];
      lVar17 = 0;
      do {
        dVar23 = dVar23 + (double)puVar8[lVar17] * local_c8[lVar17];
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
      (&local_f8)[lVar12] = dVar23;
      lVar12 = lVar12 + 1;
      puVar8 = puVar8 + 3;
    } while (lVar12 != 3);
    local_178 = (double)local_e8;
    local_228._0_4_ = (undefined4)local_f8;
    local_228._4_4_ = local_f8._4_4_;
    uStack_220._0_4_ = (undefined4)uStack_f0;
    uStack_220._4_4_ = uStack_f0._4_4_;
  }
  else {
    local_228 = 0.0;
    uStack_220 = 0.0;
    local_218[0] = 0.0;
    puVar8 = local_a8;
    lVar12 = 0;
    do {
      dVar23 = (double)(&local_228)[lVar12];
      lVar17 = 0;
      do {
        dVar23 = dVar23 + (double)puVar8[lVar17] * local_c8[lVar17];
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
      (&local_228)[lVar12] = dVar23;
      lVar12 = lVar12 + 1;
      puVar8 = puVar8 + 3;
    } while (lVar12 != 3);
    local_178 = local_218[0];
  }
  local_188 = CONCAT44(local_228._4_4_,(undefined4)local_228);
  uStack_180 = CONCAT44(uStack_220._4_4_,(undefined4)uStack_220);
  lVar12 = 0;
  do {
    (idat->f1).super_Vector<double,_3U>.data_[lVar12] =
         (double)(&local_188)[lVar12] + (idat->f1).super_Vector<double,_3U>.data_[lVar12];
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  return;
}

Assistant:

void MAW::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    MAWInteractionData& mixer =
        MixingMap[MAWtids[idat.atid1]][MAWtids[idat.atid2]];

    RealType myPot    = 0.0;
    RealType myPotC   = 0.0;
    RealType myDeriv  = 0.0;
    RealType myDerivC = 0.0;

    RealType D_e  = mixer.De;
    RealType R_e  = mixer.Re;
    RealType beta = mixer.beta;
    RealType ca1  = mixer.ca1;
    RealType cb1  = mixer.cb1;

    Vector3d r;
    RotMat3x3d Atrans;
    if (mixer.j_is_Metal) {
      // rotate the inter-particle separation into the two different
      // body-fixed coordinate systems:
      r      = idat.A1 * idat.d;
      Atrans = idat.A1.transpose();
    } else {
      // negative sign because this is the vector from j to i:
      r      = -idat.A2 * idat.d;
      Atrans = idat.A2.transpose();
    }

    // V(r) = D_e exp(-a(r-re)(exp(-a(r-re))-2)

    RealType expt    = -beta * (idat.rij - R_e);
    RealType expfnc  = exp(expt);
    RealType expfnc2 = expfnc * expfnc;

    RealType exptC    = 0.0;
    RealType expfncC  = 0.0;
    RealType expfnc2C = 0.0;

    myPot   = D_e * (expfnc2 - 2.0 * expfnc);
    myDeriv = 2.0 * D_e * beta * (expfnc - expfnc2);

    if (idat.shiftedPot || idat.shiftedForce) {
      exptC    = -beta * (idat.rcut - R_e);
      expfncC  = exp(exptC);
      expfnc2C = expfncC * expfncC;
    }

    if (idat.shiftedPot) {
      myPotC   = D_e * (expfnc2C - 2.0 * expfncC);
      myDerivC = 0.0;
    } else if (idat.shiftedForce) {
      myPotC   = D_e * (expfnc2C - 2.0 * expfncC);
      myDerivC = 2.0 * D_e * beta * (expfncC - expfnc2C);
      myPotC += myDerivC * (idat.rij - idat.rcut);
    } else {
      myPotC   = 0.0;
      myDerivC = 0.0;
    }

    RealType x  = r.x();
    RealType y  = r.y();
    RealType z  = r.z();
    RealType x2 = x * x;
    RealType z2 = z * z;

    RealType r3 = idat.r2 * idat.rij;
    RealType r4 = idat.r2 * idat.r2;

    // angular modulation of morse part of potential to approximate
    // the squares of the two HOMO lone pair orbitals in water:
    //********************** old form*************************
    // s = 1 / (4 pi)
    // ta1 = (s - pz)^2 = (1 - sqrt(3)*cos(theta))^2 / (4 pi)
    // b1 = px^2 = 3 * (sin(theta)*cos(phi))^2 / (4 pi)
    //********************** old form*************************
    // we'll leave out the 4 pi for now

    // new functional form just using the p orbitals.
    // Vmorse(r)*[a*p_x + b p_z + (1-a-b)]
    // which is
    // Vmorse(r)*[a sin^2(theta) cos^2(phi) + b cos(theta) + (1-a-b)]
    // Vmorse(r)*[a*x2/r2 + b*z/r + (1-a-b)]

    RealType Vmorse = (myPot - myPotC);
    RealType Vang = ca1 * x2 / idat.r2 + cb1 * z / idat.rij + (0.8 - ca1 / 3.0);

    RealType pot_temp = idat.vdwMult * Vmorse * Vang;
    idat.vpair += pot_temp;
    idat.pot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;
    if (idat.isSelected) idat.selePot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;
    Vector3d dVmorsedr = (myDeriv - myDerivC) * Vector3d(x, y, z) / idat.rij;

    Vector3d dVangdr = Vector3d(
        -2.0 * ca1 * x2 * x / r4 + 2.0 * ca1 * x / idat.r2 - cb1 * x * z / r3,
        -2.0 * ca1 * x2 * y / r4 - cb1 * z * y / r3,
        -2.0 * ca1 * x2 * z / r4 + cb1 / idat.rij - cb1 * z2 / r3);

    // chain rule to put these back on x, y, z

    Vector3d dvdr = Vang * dVmorsedr + Vmorse * dVangdr;

    // Torques for Vang using method of Price:
    // S. L. Price, A. J. Stone, and M. Alderton, Mol. Phys. 52, 987 (1984).

    Vector3d dVangdu = Vector3d(
        cb1 * y / idat.rij, 2.0 * ca1 * x * z / idat.r2 - cb1 * x / idat.rij,
        -2.0 * ca1 * y * x / idat.r2);

    // do the torques first since they are easy:
    // remember that these are still in the body fixed axes

    Vector3d trq = idat.vdwMult * Vmorse * dVangdu * idat.sw;

    // go back to lab frame using transpose of rotation matrix:

    if (mixer.j_is_Metal) {
      idat.t1 += Atrans * trq;
    } else {
      idat.t2 += Atrans * trq;
    }

    // Now, on to the forces (still in body frame of water)

    Vector3d ftmp = idat.vdwMult * idat.sw * dvdr;

    // rotate the terms back into the lab frame:
    Vector3d flab;
    if (mixer.j_is_Metal) {
      flab = Atrans * ftmp;
    } else {
      flab = -Atrans * ftmp;
    }

    idat.f1 += flab;

    return;
  }